

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID ImGui::DockBuilderAddNode(ImGuiID id,ImGuiDockNodeFlags flags)

{
  ImGuiContext *pIVar1;
  uint in_ESI;
  ImGuiID in_EDI;
  ImGuiID in_stack_0000000c;
  ImGuiDockNode *node;
  ImGuiContext *ctx;
  ImGuiWindowClass *in_stack_00000138;
  ImGuiDockNodeFlags in_stack_00000144;
  ImVec2 *in_stack_00000148;
  ImGuiID in_stack_00000154;
  ImGuiID in_stack_ffffffffffffffdc;
  ImVec2 in_stack_ffffffffffffffe0;
  ImGuiDockNode *local_18;
  
  pIVar1 = GImGui;
  local_18 = (ImGuiDockNode *)0x0;
  if ((in_ESI & 0x400) == 0) {
    if (in_EDI != 0) {
      local_18 = DockContextFindNodeByID
                           ((ImGuiContext *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    }
    if (local_18 == (ImGuiDockNode *)0x0) {
      local_18 = DockContextAddNode((ImGuiContext *)node,in_stack_0000000c);
    }
    local_18->LocalFlags = in_ESI;
  }
  else {
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffe0,0.0,0.0);
    DockSpace(in_stack_00000154,in_stack_00000148,in_stack_00000144,in_stack_00000138);
    local_18 = DockContextFindNodeByID((ImGuiContext *)in_stack_ffffffffffffffe0,in_EDI);
  }
  local_18->LastFrameAlive = pIVar1->FrameCount;
  return local_18->ID;
}

Assistant:

ImGuiID ImGui::DockBuilderAddNode(ImGuiID id, ImGuiDockNodeFlags flags)
{
    ImGuiContext* ctx = GImGui;
    ImGuiDockNode* node = NULL;
    if (flags & ImGuiDockNodeFlags_DockSpace)
    {
        DockSpace(id, ImVec2(0, 0), (flags & ~ImGuiDockNodeFlags_DockSpace) | ImGuiDockNodeFlags_KeepAliveOnly);
        node = DockContextFindNodeByID(ctx, id);
    }
    else
    {
        if (id != 0)
            node = DockContextFindNodeByID(ctx, id);
        if (!node)
            node = DockContextAddNode(ctx, id);
        node->LocalFlags = flags;
    }
    node->LastFrameAlive = ctx->FrameCount;   // Set this otherwise BeginDocked will undock during the same frame.
    return node->ID;
}